

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O2

unique_ptr<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_multiple_of_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent)

{
  bool bVar1;
  schema_error *this_00;
  uri *in_R8;
  allocator<char> local_119;
  string message;
  string local_f8;
  type_conflict7 value;
  uri schema_location;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"multipleOf",(allocator<char> *)&local_f8);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location
            (&schema_location,
             (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)sch,&message);
  std::__cxx11::string::~string((string *)&message);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(parent);
  if (bVar1) {
    value = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double(parent);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"multipleOf",&local_119);
    compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::get_custom_message
              (&message,(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                         *)sch,&local_f8);
    std::
    make_unique<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,double&>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,in_R8,
               &schema_location.uri_string_,(double *)&message);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&schema_location);
    return (__uniq_ptr_data<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )(__uniq_ptr_data<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
              )this;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"multipleOf must be a number value",(allocator<char> *)&local_f8);
  this_00 = (schema_error *)__cxa_allocate_exception(0x18);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                 &schema_location.uri_string_,": ");
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                 &message);
  schema_error::schema_error(this_00,&local_f8);
  __cxa_throw(this_00,&schema_error::typeinfo,schema_error::~schema_error);
}

Assistant:

std::unique_ptr<multiple_of_validator<Json>> make_multiple_of_validator(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent)
        {
            uri schema_location = context.make_schema_location("multipleOf");
            if (!sch.is_number())
            {
                const std::string message("multipleOf must be a number value");
                JSONCONS_THROW(schema_error(schema_location.string() + ": " + message));
            }
            auto value = sch.template as<double>();
            return jsoncons::make_unique<multiple_of_validator<Json>>(parent, schema_location, 
                context.get_custom_message("multipleOf"), value);
        }